

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

Fraig_HashTable_t * Fraig_HashTableCreate(int nSize)

{
  int iVar1;
  Fraig_HashTable_t *__s;
  Fraig_Node_t **ppFVar2;
  Fraig_HashTable_t *p;
  int nSize_local;
  
  __s = (Fraig_HashTable_t *)malloc(0x10);
  memset(__s,0,0x10);
  iVar1 = Abc_PrimeCudd(nSize);
  __s->nBins = iVar1;
  ppFVar2 = (Fraig_Node_t **)malloc((long)__s->nBins << 3);
  __s->pBins = ppFVar2;
  memset(__s->pBins,0,(long)__s->nBins << 3);
  return __s;
}

Assistant:

Fraig_HashTable_t * Fraig_HashTableCreate( int nSize )
{
    Fraig_HashTable_t * p;
    // allocate the table
    p = ABC_ALLOC( Fraig_HashTable_t, 1 );
    memset( p, 0, sizeof(Fraig_HashTable_t) );
    // allocate and clean the bins
    p->nBins = Abc_PrimeCudd(nSize);
    p->pBins = ABC_ALLOC( Fraig_Node_t *, p->nBins );
    memset( p->pBins, 0, sizeof(Fraig_Node_t *) * p->nBins );
    return p;
}